

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# njd_set_unvoiced_vowel.c
# Opt level: O0

void njd_set_unvoiced_vowel(NJD *njd)

{
  int iVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  size_t sVar5;
  undefined8 *in_RDI;
  int atype3;
  int atype2;
  int atype1;
  int midx3;
  int midx2;
  int midx1;
  int flag3;
  int flag2;
  int flag1;
  int size3;
  int size2;
  int size1;
  NJDNode *nlink3;
  NJDNode *nlink2;
  NJDNode *nlink1;
  char *mora3;
  char *mora2;
  char *mora1;
  char *str;
  char buff [1024];
  int len;
  int index;
  NJDNode *node;
  char *in_stack_fffffffffffffb68;
  NJDNode *in_stack_fffffffffffffb70;
  char *in_stack_fffffffffffffb78;
  int local_480;
  int local_47c;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int local_458;
  int index_00;
  NJDNode *node_00;
  NJDNode *node_01;
  NJDNode *local_448;
  NJDNode *node_02;
  int *atype;
  int *piVar17;
  int *local_430;
  int *local_428;
  char local_418 [1024];
  int local_18;
  int local_14;
  NJDNode *local_10;
  
  local_428 = (int *)0x0;
  local_430 = (int *)0x0;
  atype = (int *)0x0;
  node_02 = (NJDNode *)0x0;
  local_448 = (NJDNode *)0x0;
  node_00 = (NJDNode *)0x0;
  index_00 = 0;
  local_458 = 0;
  iVar15 = 0;
  iVar14 = -1;
  iVar12 = -1;
  iVar10 = -1;
  iVar9 = 0;
  iVar8 = 1;
  iVar7 = 2;
  iVar6 = 0;
  local_47c = 0;
  local_480 = 0;
  local_10 = (NJDNode *)*in_RDI;
  do {
    if (local_10 == (NJDNode *)0x0) {
      return;
    }
    local_418[0] = '\0';
    pcVar4 = NJDNode_get_pron(local_10);
    sVar5 = strlen(pcVar4);
    local_18 = (int)sVar5;
    local_14 = 0;
    iVar1 = local_47c;
    iVar16 = local_458;
    node_01 = local_448;
    while (local_448 = node_01, local_458 = iVar16, local_47c = iVar1, local_14 < local_18) {
      if (local_428 == (int *)0x0) {
        get_mora_information
                  (node_00,index_00,(char **)CONCAT44(iVar15,iVar14),
                   (NJDNode **)CONCAT44(iVar12,iVar10),(int *)CONCAT44(iVar9,iVar8),
                   (int *)CONCAT44(iVar7,iVar6),(int *)node_02,atype);
        fprintf(_stderr,"WARNING: set_unvoiced_vowel() in njd_set_unvoiced_vowel.c: Wrong pron.");
        return;
      }
      iVar3 = iVar7;
      iVar2 = iVar8;
      iVar11 = iVar10;
      iVar13 = iVar12;
      iVar16 = iVar15;
      node_01 = node_00;
      piVar17 = atype;
      if (local_430 == (int *)0x0) {
        iVar2 = iVar9 + 1;
        in_stack_fffffffffffffb68 = &stack0xfffffffffffffb90;
        in_stack_fffffffffffffb70 = (NJDNode *)&local_47c;
        local_47c = iVar6;
        get_mora_information
                  (node_00,index_00,(char **)CONCAT44(iVar15,iVar14),
                   (NJDNode **)CONCAT44(iVar12,iVar10),(int *)CONCAT44(iVar9,iVar2),
                   (int *)CONCAT44(iVar7,iVar6),(int *)node_02,atype);
        iVar3 = iVar7;
        iVar11 = iVar10;
        iVar13 = iVar12;
        iVar16 = iVar15;
        node_01 = node_00;
        piVar17 = atype;
      }
      if (piVar17 == (int *)0x0) {
        iVar3 = iVar2 + 1;
        local_480 = local_47c;
        in_stack_fffffffffffffb68 = &stack0xfffffffffffffb8c;
        in_stack_fffffffffffffb70 = (NJDNode *)&local_480;
        get_mora_information
                  (node_01,index_00,(char **)CONCAT44(iVar16,iVar14),
                   (NJDNode **)CONCAT44(iVar13,iVar11),(int *)CONCAT44(iVar9,iVar2),
                   (int *)CONCAT44(iVar3,iVar6),(int *)node_02,(int *)0x0);
      }
      if (((((local_430 != (int *)0x0) && (piVar17 != (int *)0x0)) && (node_02 == local_448)) &&
          (local_448 != node_01)) &&
         (((iVar8 = strcmp((char *)local_428,anon_var_dwarf_b4a55 + 3), iVar8 == 0 ||
           (iVar8 = strcmp((char *)local_428,anon_var_dwarf_1b7a), iVar8 == 0)) &&
          (iVar8 = strcmp((char *)local_430,anon_var_dwarf_b6a48 + 0xc), iVar8 == 0)))) {
        pcVar4 = NJDNode_get_pos(local_448);
        iVar8 = strcmp(pcVar4,anon_var_dwarf_b5858 + 3);
        if (iVar8 != 0) {
          pcVar4 = NJDNode_get_pos(local_448);
          iVar8 = strcmp(pcVar4,anon_var_dwarf_b6aa0 + 6);
          if (iVar8 != 0) {
            pcVar4 = NJDNode_get_pos(local_448);
            iVar8 = strcmp(pcVar4,anon_var_dwarf_b5858);
            if (iVar8 != 0) goto LAB_001862ed;
          }
        }
        pcVar4 = NJDNode_get_pron(node_01);
        iVar8 = strcmp(pcVar4,anon_var_dwarf_14fa);
        if (iVar8 != 0) {
          pcVar4 = NJDNode_get_pron(node_01);
          iVar8 = strcmp(pcVar4,anon_var_dwarf_b43f7 + 6);
          if (iVar8 != 0) {
            iVar13 = 1;
            goto LAB_001862ed;
          }
        }
        iVar13 = 0;
      }
LAB_001862ed:
      if (((iVar14 != 1) && (iVar13 == -1)) && ((iVar11 != 1 && (local_430 != (int *)0x0)))) {
        pcVar4 = NJDNode_get_pron(local_448);
        iVar8 = strcmp(pcVar4,anon_var_dwarf_b6ab6 + 0xf);
        if (iVar8 == 0) {
          pcVar4 = NJDNode_get_pos(local_448);
          iVar8 = strcmp(pcVar4,anon_var_dwarf_b5858 + 3);
          if (iVar8 != 0) {
            pcVar4 = NJDNode_get_pos(local_448);
            iVar8 = strcmp(pcVar4,anon_var_dwarf_b6aa0 + 6);
            if (iVar8 != 0) {
              pcVar4 = NJDNode_get_pos(local_448);
              iVar8 = strcmp(pcVar4,anon_var_dwarf_b65c7 + 10);
              if (iVar8 != 0) goto LAB_001863eb;
            }
          }
          if (local_47c == iVar2 + 1) {
            iVar13 = 0;
          }
          else {
            iVar13 = apply_unvoice_rule(in_stack_fffffffffffffb78,(char *)in_stack_fffffffffffffb70)
            ;
          }
          if (iVar13 == 1) {
            if (iVar14 == -1) {
              iVar14 = 0;
            }
            if (iVar11 == -1) {
              iVar11 = 0;
            }
          }
        }
      }
LAB_001863eb:
      if (iVar14 == -1) {
        pcVar4 = NJDNode_get_pos(node_02);
        iVar8 = strcmp(pcVar4,anon_var_dwarf_b1847);
        if (iVar8 == 0) {
          iVar14 = 0;
        }
        else if (iVar13 == 1) {
          iVar14 = 0;
        }
        else if (iVar6 == iVar9 + 1) {
          iVar14 = 0;
        }
        else {
          iVar14 = apply_unvoice_rule(in_stack_fffffffffffffb78,(char *)in_stack_fffffffffffffb70);
        }
      }
      if ((iVar14 == 1) && (iVar13 == -1)) {
        iVar13 = 0;
      }
      strcat(local_418,(char *)local_428);
      if (iVar14 == 1) {
        strcat(local_418,anon_var_dwarf_131a);
      }
      local_428 = local_430;
      iVar1 = local_480;
      atype = (int *)0x0;
      node_00 = (NJDNode *)0x0;
      iVar15 = 0;
      iVar10 = -1;
      iVar7 = 0;
      local_480 = 0;
      local_14 = index_00 + local_14;
      iVar6 = local_47c;
      iVar8 = iVar3;
      iVar9 = iVar2;
      iVar12 = iVar11;
      iVar14 = iVar13;
      index_00 = local_458;
      node_02 = local_448;
      local_430 = piVar17;
    }
    NJDNode_set_pron(in_stack_fffffffffffffb70,in_stack_fffffffffffffb68);
    local_10 = local_10->next;
  } while( true );
}

Assistant:

void njd_set_unvoiced_vowel(NJD * njd)
{
   NJDNode *node;
   int index;
   int len;
   char buff[MAXBUFLEN];
   const char *str;

   /* mora information for current, next, and next-next moras */
   const char *mora1 = NULL, *mora2 = NULL, *mora3 = NULL;
   NJDNode *nlink1 = NULL, *nlink2 = NULL, *nlink3 = NULL;
   int size1 = 0, size2 = 0, size3 = 0;
   int flag1 = -1, flag2 = -1, flag3 = -1;      /* unknown:-1, voice:0, unvoiced:1 */
   int midx1 = 0, midx2 = 1, midx3 = 2;
   int atype1 = 0, atype2 = 0, atype3 = 0;

   for (node = njd->head; node != NULL; node = node->next) {
      buff[0] = '\0';

      /* get pronunciation */
      str = NJDNode_get_pron(node);
      len = strlen(str);

      /* parse pronunciation */
      for (index = 0; index < len;) {
         /* get mora information */
         if (mora1 == NULL)
            get_mora_information(node, index, &mora1, &nlink1, &flag1, &size1, &midx1, &atype1);
         if (mora1 == NULL) {
            fprintf(stderr,
                    "WARNING: set_unvoiced_vowel() in njd_set_unvoiced_vowel.c: Wrong pron.");
            return;
         }
         if (mora2 == NULL) {
            midx2 = midx1 + 1;
            atype2 = atype1;
            get_mora_information(node, index + size1, &mora2, &nlink2, &flag2, &size2, &midx2,
                                 &atype2);
         }
         if (mora3 == NULL) {
            midx3 = midx2 + 1;
            atype3 = atype2;
            get_mora_information(node, index + size1 + size2, &mora3, &nlink3, &flag3, &size3,
                                 &midx3, &atype3);
         }

         /* rule 1: look-ahead for 'masu' and 'desu' */
         if (mora2 != NULL && mora3 != NULL && nlink1 == nlink2 && nlink2 != nlink3 &&
             (strcmp(mora1, NJD_SET_UNVOICED_VOWEL_MA) == 0
              || strcmp(mora1, NJD_SET_UNVOICED_VOWEL_DE) == 0)
             && strcmp(mora2, NJD_SET_UNVOICED_VOWEL_SU) == 0
             && (strcmp(NJDNode_get_pos(nlink2), NJD_SET_UNVOICED_VOWEL_DOUSHI) == 0
                 || strcmp(NJDNode_get_pos(nlink2), NJD_SET_UNVOICED_VOWEL_JODOUSHI) == 0
                 || strcmp(NJDNode_get_pos(nlink2), NJD_SET_UNVOICED_VOWEL_KANDOUSHI) == 0)
             ) {
            if (strcmp(NJDNode_get_pron(nlink3), NJD_SET_UNVOICED_VOWEL_QUESTION) == 0
                || strcmp(NJDNode_get_pron(nlink3), NJD_SET_UNVOICED_VOWEL_CHOUON) == 0)
               flag2 = 0;
            else
               flag2 = 1;
         }

         /* rule 2: look-ahead for 'shi' */
         if (flag1 != 1 && flag2 == -1 && flag3 != 1 && mora2 != NULL &&
             strcmp(NJDNode_get_pron(nlink2), NJD_SET_UNVOICED_VOWEL_SHI) == 0 &&
             (strcmp(NJDNode_get_pos(nlink2), NJD_SET_UNVOICED_VOWEL_DOUSHI) == 0 ||
              strcmp(NJDNode_get_pos(nlink2), NJD_SET_UNVOICED_VOWEL_JODOUSHI) == 0 ||
              strcmp(NJDNode_get_pos(nlink2), NJD_SET_UNVOICED_VOWEL_JOSHI) == 0)) {
            if (atype2 == midx2 + 1) {
               /* rule 4 */
               flag2 = 0;
            } else {
               /* rule 5 */
               flag2 = apply_unvoice_rule(mora2, mora3);
            }
            if (flag2 == 1) {
               if (flag1 == -1)
                  flag1 = 0;
               if (flag3 == -1)
                  flag3 = 0;
            }
         }

         /* estimate unvoice */
         if (flag1 == -1) {
            if (strcmp(NJDNode_get_pos(nlink1), NJD_SET_UNVOICED_VOWEL_FILLER) == 0) {
               /* rule 0 */
               flag1 = 0;
            } else if (flag2 == 1) {
               /* rule 3 */
               flag1 = 0;
            } else if (atype1 == midx1 + 1) {
               /* rule 4 */
               flag1 = 0;
            } else {
               /* rule 5 */
               flag1 = apply_unvoice_rule(mora1, mora2);
            }
         }
         if (flag1 == 1 && flag2 == -1) {
            flag2 = 0;
         }

         /* store pronunciation */
         strcat(buff, mora1);
         if (flag1 == 1)
            strcat(buff, NJD_SET_UNVOICED_VOWEL_QUOTATION);

         /* prepare next step */
         index += size1;

         mora1 = mora2;
         nlink1 = nlink2;
         size1 = size2;
         flag1 = flag2;
         midx1 = midx2;
         atype1 = atype2;

         mora2 = mora3;
         nlink2 = nlink3;
         size2 = size3;
         flag2 = flag3;
         midx2 = midx3;
         atype2 = atype3;

         mora3 = NULL;
         nlink3 = NULL;
         size3 = 0;
         flag3 = -1;
         midx3 = 0;
         atype3 = 0;
      }

      NJDNode_set_pron(node, buff);
   }
}